

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spe-impl.inc.c
# Opt level: O0

void gen_evcmpeq_speundef(DisasContext_conflict10 *ctx)

{
  uint32_t uVar1;
  DisasContext_conflict10 *ctx_local;
  
  uVar1 = Rc(ctx->opcode);
  if (uVar1 == 0) {
    gen_evcmpeq(ctx);
  }
  else {
    gen_speundef(ctx);
  }
  return;
}

Assistant:

static inline void gen_addr_spe_imm_index(DisasContext *ctx, TCGv EA, int sh)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    target_ulong uimm = rB(ctx->opcode);

    if (rA(ctx->opcode) == 0) {
        tcg_gen_movi_tl(tcg_ctx, EA, uimm << sh);
    } else {
        tcg_gen_addi_tl(tcg_ctx, EA, cpu_gpr[rA(ctx->opcode)], uimm << sh);
        if (NARROW_MODE(ctx)) {
            tcg_gen_ext32u_tl(tcg_ctx, EA, EA);
        }
    }
}